

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Catalog::BindAlterAddIndex
          (Catalog *this,Binder *binder,TableCatalogEntry *table_entry,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *plan,unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                *create_info,
          unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
          *alter_info)

{
  string *msg;
  allocator *this_00;
  allocator local_51;
  string local_50 [80];
  
  msg = (string *)__cxa_allocate_exception(0x10);
  this_00 = &local_51;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_50,"BindAlterAddIndex not supported by this catalog",this_00)
  ;
  NotImplementedException::NotImplementedException((NotImplementedException *)this_00,msg);
  __cxa_throw(msg,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

unique_ptr<LogicalOperator> Catalog::BindAlterAddIndex(Binder &binder, TableCatalogEntry &table_entry,
                                                       unique_ptr<LogicalOperator> plan,
                                                       unique_ptr<CreateIndexInfo> create_info,
                                                       unique_ptr<AlterTableInfo> alter_info) {
	throw NotImplementedException("BindAlterAddIndex not supported by this catalog");
}